

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::
Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>_>_>
::dispose(Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>_>_>
          *this)

{
  AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>_>
  *object;
  AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>_>
  *ptrCopy;
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>_>_>
  *this_local;
  
  object = this->ptr;
  if (object != (AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>_>
                 *)0x0) {
    this->ptr = (AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>_>
                 *)0x0;
    Disposer::
    dispose<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::NullInputStream>,kj::String,kj::Own<kj::HttpHeaders>>>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }